

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O2

void __thiscall AbstractModuleClient::~AbstractModuleClient(AbstractModuleClient *this)

{
  ~AbstractModuleClient(this);
  operator_delete(this,0x1b8);
  return;
}

Assistant:

AbstractModuleClient::~AbstractModuleClient() {
    this->closeConnections();
}